

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

int Gia_MuxDeref(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  
  pObj = Gia_ManObj(p,iObj);
  if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[iObj] != 0)) {
    iVar1 = Gia_ObjFaninId0p(p,pObj);
    iVar1 = Gia_MuxDeref_rec(p,iVar1);
    iVar2 = Gia_ObjFaninId1p(p,pObj);
    iVar2 = Gia_MuxDeref_rec(p,iVar2);
    iVar3 = Gia_ObjFaninId2p(p,pObj);
    iVar3 = Gia_MuxDeref_rec(p,iVar3);
    return iVar3 + iVar2 + iVar1 + 1;
  }
  __assert_fail("Gia_ObjIsMuxId(p, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMuxes.c"
                ,0x155,"int Gia_MuxDeref(Gia_Man_t *, int)");
}

Assistant:

int Gia_MuxDeref( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    assert( Gia_ObjIsMuxId(p, iObj) );
    return Gia_MuxDeref_rec( p, Gia_ObjFaninId0p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId1p(p, pObj) ) + 
           Gia_MuxDeref_rec( p, Gia_ObjFaninId2p(p, pObj) ) + 1;
}